

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int set_file_compression(char **argv)

{
  char *pcVar1;
  FILE *__stream;
  zip_int32_t zVar2;
  int iVar3;
  ulonglong uVar4;
  ulonglong uVar5;
  undefined8 uVar6;
  zip_uint64_t idx;
  zip_uint32_t flags;
  zip_int32_t method;
  char **argv_local;
  
  uVar4 = strtoull(*argv,(char **)0x0,10);
  zVar2 = get_compression_method(argv[1]);
  uVar5 = strtoull(argv[2],(char **)0x0,10);
  iVar3 = zip_set_file_compression(za,uVar4,zVar2,uVar5 & 0xffffffff);
  __stream = _stderr;
  if (iVar3 < 0) {
    pcVar1 = argv[1];
    uVar6 = zip_strerror(za);
    fprintf(__stream,
            "can\'t set file compression method at index \'%lu\' to \'%s\', flags \'%u\': %s\n",
            uVar4,pcVar1,uVar5 & 0xffffffff,uVar6);
    argv_local._4_4_ = -1;
  }
  else {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

static int
set_file_compression(char *argv[]) {
    zip_int32_t method;
    zip_uint32_t flags;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    method = get_compression_method(argv[1]);
    flags = (zip_uint32_t)strtoull(argv[2], NULL, 10);
    if (zip_set_file_compression(za, idx, method, flags) < 0) {
        fprintf(stderr, "can't set file compression method at index '%" PRIu64 "' to '%s', flags '%" PRIu32 "': %s\n", idx, argv[1], flags, zip_strerror(za));
        return -1;
    }
    return 0;
}